

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * pack21_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x200000 | uVar1 - base;
  uVar2 = in[1] - base >> 0xb;
  out[1] = uVar2;
  uVar2 = (in[2] - base) * 0x400 | uVar2;
  out[1] = uVar2;
  out[1] = (in[3] - base) * -0x80000000 | uVar2;
  uVar2 = in[3] - base >> 1;
  out[2] = uVar2;
  out[2] = (in[4] - base) * 0x100000 | uVar2;
  uVar2 = in[4] - base >> 0xc;
  out[3] = uVar2;
  uVar2 = (in[5] - base) * 0x200 | uVar2;
  out[3] = uVar2;
  out[3] = (in[6] - base) * 0x40000000 | uVar2;
  uVar2 = in[6] - base >> 2;
  out[4] = uVar2;
  out[4] = (in[7] - base) * 0x80000 | uVar2;
  uVar2 = in[7] - base >> 0xd;
  out[5] = uVar2;
  uVar2 = (in[8] - base) * 0x100 | uVar2;
  out[5] = uVar2;
  out[5] = (in[9] - base) * 0x20000000 | uVar2;
  uVar2 = in[9] - base >> 3;
  out[6] = uVar2;
  out[6] = (in[10] - base) * 0x40000 | uVar2;
  uVar2 = in[10] - base >> 0xe;
  out[7] = uVar2;
  uVar2 = (in[0xb] - base) * 0x80 | uVar2;
  out[7] = uVar2;
  out[7] = (in[0xc] - base) * 0x10000000 | uVar2;
  uVar2 = in[0xc] - base >> 4;
  out[8] = uVar2;
  out[8] = (in[0xd] - base) * 0x20000 | uVar2;
  uVar2 = in[0xd] - base >> 0xf;
  out[9] = uVar2;
  uVar2 = (in[0xe] - base) * 0x40 | uVar2;
  out[9] = uVar2;
  out[9] = (in[0xf] - base) * 0x8000000 | uVar2;
  out[10] = in[0xf] - base >> 5;
  return out + 0xb;
}

Assistant:

uint32_t * pack21_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  16 );
    ++in;

    return out + 1;
}